

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserAnimation.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyParserAnimation::ParseValue
          (PropertyParserAnimation *this,Property *property,String *value,ParameterMap *param_3)

{
  bool bVar1;
  StringList list_of_values;
  String local_50;
  String lowercase_value;
  
  list_of_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list_of_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list_of_values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&local_50,(string *)value);
  StringUtilities::ToLower(&lowercase_value,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  StringUtilities::ExpandString(&list_of_values,&lowercase_value,',');
  ::std::__cxx11::string::~string((string *)&lowercase_value);
  if (this->type == TRANSITION_PARSER) {
    bVar1 = ParseTransition(property,&list_of_values);
  }
  else if (this->type == ANIMATION_PARSER) {
    bVar1 = ParseAnimation(property,&list_of_values);
  }
  else {
    bVar1 = false;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&list_of_values);
  return bVar1;
}

Assistant:

bool PropertyParserAnimation::ParseValue(Property& property, const String& value, const ParameterMap& /*parameters*/) const
{
	StringList list_of_values;
	{
		auto lowercase_value = StringUtilities::ToLower(value);
		StringUtilities::ExpandString(list_of_values, lowercase_value, ',');
	}

	bool result = false;

	if (type == ANIMATION_PARSER)
	{
		result = ParseAnimation(property, list_of_values);
	}
	else if (type == TRANSITION_PARSER)
	{
		result = ParseTransition(property, list_of_values);
	}

	return result;
}